

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool __thiscall
duckdb::HugeintToDecimalCast<duckdb::hugeint_t>
          (duckdb *this,hugeint_t input,hugeint_t *result,CastParameters *parameters,uint8_t width,
          uint8_t scale)

{
  bool bVar1;
  hugeint_t *result_00;
  uchar params_2;
  undefined3 in_register_00000089;
  uint uVar2;
  uint uVar3;
  hugeint_t input_00;
  hugeint_t hVar4;
  string error;
  hugeint_t max_width;
  hugeint_t local_a8;
  string local_98;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  hugeint_t local_58;
  string local_48;
  
  uVar2 = CONCAT31(in_register_00000089,width);
  local_a8.upper = input.lower;
  result_00 = (hugeint_t *)((((ulong)parameters & 0xffffffff) - (ulong)uVar2) * 0x10);
  local_58.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + (long)result_00);
  local_58.upper = result_00[0x253415].upper;
  uVar3 = uVar2;
  local_a8.lower = (uint64_t)this;
  bVar1 = hugeint_t::operator>=(&local_a8,&local_58);
  params_2 = (uchar)uVar3;
  if (!bVar1) {
    local_98._0_16_ = hugeint_t::operator-(&local_58);
    bVar1 = hugeint_t::operator<=(&local_a8,(hugeint_t *)&local_98);
    if (!bVar1) {
      hVar4 = hugeint_t::operator*(&local_a8,(hugeint_t *)(Hugeint::POWERS_OF_TEN + (uVar2 << 4)));
      hugeint_t::hugeint_t((hugeint_t *)&local_98,0);
      input_00.upper = (int64_t)&local_98;
      input_00.lower = hVar4.upper;
      Hugeint::TryCast<duckdb::hugeint_t>((Hugeint *)hVar4.lower,input_00,result_00);
      *(uint64_t *)input.upper = (uint64_t)local_98._M_dataplus._M_p;
      ((uint64_t *)input.upper)[1] = local_98._M_string_length;
      return true;
    }
  }
  local_78[0] = local_68;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"Could not cast value %s to DECIMAL(%d,%d)","");
  hugeint_t::ToString_abi_cxx11_(&local_48,&local_a8);
  StringUtil::Format<std::__cxx11::string,unsigned_char,unsigned_char>
            (&local_98,(StringUtil *)local_78,&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)parameters & 0xff),width,params_2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  HandleCastError::AssignError(&local_98,(CastParameters *)result);
  if ((hugeint_t *)local_98._M_dataplus._M_p != (hugeint_t *)&local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  return false;
}

Assistant:

bool HugeintToDecimalCast(hugeint_t input, DST &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	// check for overflow
	hugeint_t max_width = Hugeint::POWERS_OF_TEN[width - scale];
	if (input >= max_width || input <= -max_width) {
		string error = StringUtil::Format("Could not cast value %s to DECIMAL(%d,%d)", input.ToString(), width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = Hugeint::Cast<DST>(input * Hugeint::POWERS_OF_TEN[scale]);
	return true;
}